

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void do_blindness_dust(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  CHAR_DATA *pCVar2;
  CHAR_DATA *pCVar3;
  CHAR_DATA *victim;
  bool bVar4;
  int iVar5;
  int iVar6;
  CClass *this;
  char *pcVar7;
  long lVar8;
  AFFECT_DATA af;
  char buf [4608];
  AFFECT_DATA local_12a0;
  char local_1238 [4616];
  
  iVar5 = get_skill(ch,(int)gsn_blindness_dust);
  if (iVar5 != 0) {
    sVar1 = ch->level;
    lVar8 = (long)gsn_blindness_dust;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar6 = CClass::GetIndex(this);
    if (*(short *)(lVar8 * 0x60 + 0x45a788 + (long)iVar6 * 2) <= sVar1) {
      if (0x11 < ch->mana) {
        iVar6 = number_percent();
        if ((float)iVar6 <= (float)iVar5) {
          act("$n hurls a handful of dust into the room!",ch,(void *)0x0,(void *)0x0,0);
          send_to_char("You throw a handful of blindness dust into the room!\n\r",ch);
          check_improve(ch,(int)gsn_blindness_dust,true,2);
          pCVar2 = ch->fighting;
          init_affect(&local_12a0);
          local_12a0.where = 0;
          local_12a0.type = gsn_blindness_dust;
          local_12a0.level = ch->level;
          local_12a0.duration = local_12a0.level / 10;
          local_12a0.bitvector[0]._0_1_ = (byte)local_12a0.bitvector[0] | 1;
          local_12a0.location = 0x12;
          local_12a0.modifier = -3;
          local_12a0.aftype = 1;
          ch->mana = ch->mana + -0x12;
          local_12a0.mod_name = 0;
          WAIT_STATE(ch,0xc);
          pCVar3 = ch->in_room->people;
          while (victim = pCVar3, victim != (CHAR_DATA *)0x0) {
            pCVar3 = victim->next_in_room;
            bVar4 = is_safe_new(ch,victim,true);
            if ((((!bVar4) && (bVar4 = is_immortal(victim), !bVar4)) &&
                (bVar4 = is_same_group(ch,victim), !bVar4)) &&
               (bVar4 = is_same_cabal(ch,victim), !bVar4)) {
              bVar4 = is_affected_by(victim,0);
              if ((!bVar4) && (bVar4 = saves_spell((int)ch->level,victim,0x10), !bVar4)) {
                act("$n appears blinded.",victim,(void *)0x0,(void *)0x0,0);
                send_to_char("You get dust in your eyes.\n\r",victim);
                affect_to_char(victim,&local_12a0);
              }
              bVar4 = is_npc(victim);
              if (((!bVar4) && (bVar4 = is_npc(ch), !bVar4)) &&
                 ((victim->fighting == (CHAR_DATA *)0x0 || (pCVar2 == (CHAR_DATA *)0x0)))) {
                pcVar7 = pers(ch,victim);
                sprintf(local_1238,"Help! %s just threw dust in my eyes!",pcVar7);
                do_myell(victim,local_1238,ch);
              }
              if (victim->fighting == (CHAR_DATA *)0x0) {
                multi_hit(victim,ch,-1);
              }
            }
          }
          return;
        }
        act("$n hurls some dust into the air but it is blown away.",ch,(void *)0x0,(void *)0x0,0);
        send_to_char("You throw out some dust but it is blown away.\n\r",ch);
        ch->mana = ch->mana + -9;
        check_improve(ch,(int)gsn_blindness_dust,false,2);
        WAIT_STATE(ch,0xc);
        return;
      }
      pcVar7 = "You don\'t have the mana.\n\r";
      goto LAB_0029d260;
    }
  }
  pcVar7 = "You don\'t know how to make blindness dust to throw.\n\r";
LAB_0029d260:
  send_to_char(pcVar7,ch);
  return;
}

Assistant:

void do_blindness_dust(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	AFFECT_DATA af;
	float chance;
	bool fighting = false;
	char buf[MAX_STRING_LENGTH];

	chance = get_skill(ch, gsn_blindness_dust);

	if (chance == 0
		|| ch->level < skill_table[gsn_blindness_dust].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to make blindness dust to throw.\n\r", ch);
		return;
	}

	if (ch->mana < 18)
	{
		send_to_char("You don't have the mana.\n\r", ch);
		return;
	}

	if (number_percent() > chance)
	{
		act("$n hurls some dust into the air but it is blown away.", ch, 0, 0, TO_ROOM);
		send_to_char("You throw out some dust but it is blown away.\n\r", ch);
		ch->mana -= 9;
		check_improve(ch, gsn_blindness_dust, false, 2);

		WAIT_STATE(ch, 12);
		return;
	}

	act("$n hurls a handful of dust into the room!", ch, 0, 0, TO_ROOM);
	send_to_char("You throw a handful of blindness dust into the room!\n\r", ch);
	check_improve(ch, gsn_blindness_dust, true, 2);

	if (ch->fighting != nullptr)
		fighting = true;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_blindness_dust;
	af.level = ch->level;
	af.duration = ch->level / 10;

	SET_BIT(af.bitvector, AFF_BLIND);

	af.location = APPLY_HITROLL;
	af.modifier = -3;
	af.aftype = AFT_SKILL;
	ch->mana -= 18;
	af.mod_name = MOD_VISION;

	WAIT_STATE(ch, 12);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_safe(ch, vch) || is_immortal(vch))
			continue;

		if (is_same_group(ch, vch) || is_same_cabal(ch, vch))
			continue;

		if (!is_affected_by(vch, AFF_BLIND) && !saves_spell(ch->level, vch, DAM_OTHER))
		{
			act("$n appears blinded.", vch, 0, 0, TO_ROOM);
			send_to_char("You get dust in your eyes.\n\r", vch);
			affect_to_char(vch, &af);
		}

		if (!is_npc(vch) && !is_npc(ch) && (vch->fighting == nullptr || (!fighting)))
		{
			sprintf(buf, "Help! %s just threw dust in my eyes!", pers(ch, vch));
			do_myell(vch, buf, ch);
		}

		if (vch->fighting == nullptr)
			multi_hit(vch, ch, TYPE_UNDEFINED);
	}
}